

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.cc
# Opt level: O1

Type * anon_unknown.dwarf_18535::load_numeric(TypeNode *node,Factory *factory)

{
  _Alloc_hider _Var1;
  int iVar2;
  unsigned_long uVar3;
  Numeric *this;
  runtime_error *this_00;
  char *in_RCX;
  long *plVar4;
  NumericCategory unaff_EBP;
  char *pcVar5;
  long *plVar6;
  bool bVar7;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  (anonymous_namespace)::getStringAttribute_abi_cxx11_
            (&local_50,(_anonymous_namespace_ *)node->xml,(xmlNodePtr)0x10f146,in_RCX);
  _Var1._M_p = local_50._M_dataplus._M_p;
  pcVar5 = "sint";
  plVar6 = (long *)((anonymous_namespace)::numeric_categories + 0x10);
  bVar7 = false;
  do {
    iVar2 = xmlStrcmp(_Var1._M_p,pcVar5);
    if (iVar2 == 0) {
      unaff_EBP = *(NumericCategory *)(plVar6 + -1);
      break;
    }
    pcVar5 = (char *)*plVar6;
    plVar6 = plVar6 + 2;
    bVar7 = pcVar5 == (char *)0x0;
  } while (!bVar7);
  if (bVar7) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"unrecognized XML node \'","");
    plVar6 = (long *)std::__cxx11::string::append((char *)local_70);
    local_b0 = (long *)*plVar6;
    plVar4 = plVar6 + 2;
    if (local_b0 == plVar4) {
      local_a0 = *plVar4;
      lStack_98 = plVar6[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar4;
    }
    local_a8 = plVar6[1];
    *plVar6 = (long)plVar4;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_90 = (long *)*plVar6;
    plVar4 = plVar6 + 2;
    if (local_90 == plVar4) {
      local_80 = *plVar4;
      lStack_78 = plVar6[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar4;
    }
    local_88 = plVar6[1];
    *plVar6 = (long)plVar4;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::runtime_error::runtime_error(this_00,(string *)&local_90);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  uVar3 = getAttribute<unsigned_long>(node->xml,"size");
  this = (Numeric *)operator_new(0x48);
  Typelib::Numeric::Numeric(this,(string *)&node->name,uVar3,unaff_EBP);
  Factory::insert(factory,node,(Type *)this);
  return (Type *)this;
}

Assistant:

Type const* load_numeric(TypeNode const& node, Factory& factory)
    {
        NumericCategory category = getCategoryFromNode
            ( numeric_categories
            , reinterpret_cast<xmlChar const*>(getAttribute<string>(node.xml, "category").c_str()) );
        size_t      size = getAttribute<size_t>(node.xml, "size");

        Type* type = new Numeric(node.name, size, category.type);
        factory.insert(node, type);
        return type;
    }